

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecifySymbols.cpp
# Opt level: O0

SystemTimingCheckSymbol *
slang::ast::SystemTimingCheckSymbol::fromSyntax(Scope *parent,SystemTimingCheckSyntax *syntax)

{
  string_view arg;
  SourceRange sourceRange;
  bool bVar1;
  uint n_;
  size_t sVar2;
  group_type *pgVar3;
  value_type *pvVar4;
  pointer ppVar5;
  SystemTimingCheckSymbol *this;
  SyntaxNode *in_RSI;
  WildcardImportData *in_RDI;
  iterator iVar6;
  SystemTimingCheckSymbol *result;
  Compilation *comp;
  const_iterator it;
  SystemTimingCheckDef *def;
  size_t hash;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe28;
  WildcardImportData *in_stack_fffffffffffffe30;
  Diagnostic *in_stack_fffffffffffffe38;
  Token *in_stack_fffffffffffffe40;
  Scope *__x;
  undefined1 *this_00;
  SyntaxNode *this_01;
  Token in_stack_fffffffffffffe68;
  Diagnostic *this_02;
  size_t in_stack_fffffffffffffe78;
  char *in_stack_fffffffffffffe80;
  string_view local_138;
  SymbolMap *local_128;
  Symbol *local_120;
  Symbol *local_118;
  SyntaxNode *local_110;
  WildcardImportData *local_108;
  Scope *local_100;
  undefined1 *local_f8;
  SymbolMap *local_f0;
  Symbol *local_e8;
  table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SystemTimingCheckDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
  local_e0;
  Scope *local_d0;
  undefined1 *local_c8;
  table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SystemTimingCheckDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
  local_c0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SystemTimingCheckDef>_>
  local_b0;
  Scope *this_03;
  undefined1 *puVar7;
  SourceLocation SVar8;
  DiagCode code;
  uint local_44;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  Scope *local_10;
  SyntaxNode *local_8;
  
  local_110 = in_RSI;
  local_108 = in_RDI;
  local_138 = parsing::Token::valueText(in_stack_fffffffffffffe40);
  local_f8 = SystemTimingCheckDefs;
  local_c8 = SystemTimingCheckDefs;
  puVar7 = SystemTimingCheckDefs;
  this_00 = SystemTimingCheckDefs;
  local_100 = (Scope *)&local_138;
  local_d0 = (Scope *)&local_138;
  this_03 = (Scope *)&local_138;
  sVar2 = boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SystemTimingCheckDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::SystemTimingCheckDef>>>
          ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                    ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SystemTimingCheckDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SystemTimingCheckDef>_>_>
                      *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  local_18 = boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SystemTimingCheckDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SystemTimingCheckDef>_>_>
             ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SystemTimingCheckDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SystemTimingCheckDef>_>_>
                             *)in_stack_fffffffffffffe30,(size_t)in_stack_fffffffffffffe28);
  this_01 = (SyntaxNode *)this_00;
  local_20 = sVar2;
  local_10 = (Scope *)&local_138;
  local_8 = (SyntaxNode *)this_00;
  boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_30,local_18);
  while( true ) {
    sVar2 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
    pgVar3 = boost::unordered::detail::foa::
             table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SystemTimingCheckDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SystemTimingCheckDef>_>_>
             ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SystemTimingCheckDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SystemTimingCheckDef>_>_>
                       *)0x440dfe);
    local_44 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::match((group15<boost::unordered::detail::foa::plain_integral> *)
                       in_stack_fffffffffffffe38,(size_t)in_stack_fffffffffffffe30);
    if (local_44 != 0) {
      pvVar4 = boost::unordered::detail::foa::
               table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SystemTimingCheckDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SystemTimingCheckDef>_>_>
               ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SystemTimingCheckDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SystemTimingCheckDef>_>_>
                           *)0x440e49);
      do {
        n_ = boost::unordered::detail::foa::unchecked_countr_zero(0);
        in_stack_fffffffffffffe40 =
             (Token *)boost::unordered::detail::foa::
                      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SystemTimingCheckDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SystemTimingCheckDef>_>_>
                      ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SystemTimingCheckDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SystemTimingCheckDef>_>_>
                              *)0x440e99);
        __x = local_10;
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SystemTimingCheckDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::SystemTimingCheckDef>>>
        ::
        key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::SystemTimingCheckDef>>
                  ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SystemTimingCheckDef>
                    *)0x440ec6);
        bVar1 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                          ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                           this_00,(basic_string_view<char,_std::char_traits<char>_> *)__x,
                           (basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_fffffffffffffe40);
        this_02 = (Diagnostic *)in_stack_fffffffffffffe68.info;
        if (bVar1) {
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SystemTimingCheckDef>_>
          ::table_locator(&local_b0,pgVar3 + sVar2,n_,pvVar4 + sVar2 * 0xf + (ulong)n_);
          goto LAB_00440fba;
        }
        local_44 = local_44 - 1 & local_44;
      } while (local_44 != 0);
    }
    bVar1 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                              in_stack_fffffffffffffe30,(size_t)in_stack_fffffffffffffe28);
    this_02 = (Diagnostic *)in_stack_fffffffffffffe68.info;
    if (bVar1) break;
    bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                      (&local_30,(size_t)this_01->parent);
    this_02 = (Diagnostic *)in_stack_fffffffffffffe68.info;
    if (!bVar1) {
      memset(&local_b0,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SystemTimingCheckDef>_>
      ::table_locator(&local_b0);
LAB_00440fba:
      iVar6 = boost::unordered::detail::foa::
              table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SystemTimingCheckDef>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SystemTimingCheckDef>_>_>
              ::make_iterator((locator *)0x440fc7);
      local_e0.pc_ = iVar6.pc_;
      code = iVar6.p_._4_4_;
      local_e0.p_ = iVar6.p_;
      SVar8 = (SourceLocation)local_e0.pc_;
      boost::unordered::detail::foa::
      table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SystemTimingCheckDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
      ::table_iterator<false,_nullptr>(&local_c0,&local_e0);
      local_f0 = (SymbolMap *)local_c0.pc_;
      local_e8 = (Symbol *)local_c0.p_;
      local_128 = (SymbolMap *)local_c0.pc_;
      local_120 = (Symbol *)local_c0.p_;
      boost::unordered::
      unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SystemTimingCheckDef,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SystemTimingCheckDef>_>_>
      ::end((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SystemTimingCheckDef,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SystemTimingCheckDef>_>_>
             *)0x441058);
      bVar1 = boost::unordered::detail::foa::operator!=
                        ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SystemTimingCheckDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                          *)in_stack_fffffffffffffe30,
                         (table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SystemTimingCheckDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                          *)in_stack_fffffffffffffe28);
      if (bVar1) {
        ppVar5 = boost::unordered::detail::foa::
                 table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SystemTimingCheckDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                 ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SystemTimingCheckDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                               *)in_stack_fffffffffffffe30);
        local_118 = (Symbol *)&ppVar5->second;
      }
      else {
        in_stack_fffffffffffffe30 = local_108;
        parsing::Token::range((Token *)this_00);
        sourceRange.endLoc = SVar8;
        sourceRange.startLoc = (SourceLocation)puVar7;
        in_stack_fffffffffffffe38 = Scope::addDiag(this_03,code,sourceRange);
        parsing::Token::valueText(in_stack_fffffffffffffe40);
        arg._M_str = in_stack_fffffffffffffe80;
        arg._M_len = in_stack_fffffffffffffe78;
        Diagnostic::operator<<(this_02,arg);
        local_118 = (Symbol *)0x0;
      }
      Scope::getCompilation((Scope *)local_108);
      slang::syntax::SyntaxNode::getFirstToken(this_01);
      parsing::Token::location((Token *)&stack0xfffffffffffffe68);
      this = BumpAllocator::
             emplace<slang::ast::SystemTimingCheckSymbol,slang::SourceLocation,slang::ast::SystemTimingCheckDef_const*&>
                       ((BumpAllocator *)in_stack_fffffffffffffe40,
                        (SourceLocation *)in_stack_fffffffffffffe38,
                        (SystemTimingCheckDef **)in_stack_fffffffffffffe30);
      Symbol::setSyntax(&this->super_Symbol,local_110);
      return this;
    }
  }
  memset(&local_b0,0,0x18);
  boost::unordered::detail::foa::
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SystemTimingCheckDef>_>
  ::table_locator(&local_b0);
  goto LAB_00440fba;
}

Assistant:

SystemTimingCheckSymbol& SystemTimingCheckSymbol::fromSyntax(
    const Scope& parent, const SystemTimingCheckSyntax& syntax) {

    const SystemTimingCheckDef* def;
    if (auto it = SystemTimingCheckDefs.find(syntax.name.valueText());
        it != SystemTimingCheckDefs.end()) {
        def = &it->second;
    }
    else {
        parent.addDiag(diag::UnknownSystemTimingCheck, syntax.name.range())
            << syntax.name.valueText();
        def = nullptr;
    }

    auto& comp = parent.getCompilation();
    auto result = comp.emplace<SystemTimingCheckSymbol>(syntax.getFirstToken().location(), def);
    result->setSyntax(syntax);
    return *result;
}